

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserException.cpp
# Opt level: O0

string * ninx::parser::exception::ParserException::make_message
                   (string *__return_storage_ptr__,int line,string *origin,string *message)

{
  ostream *poVar1;
  stringstream local_1b0 [8];
  stringstream s;
  ostream local_1a0 [376];
  string *local_28;
  string *message_local;
  string *origin_local;
  string *psStack_10;
  int line_local;
  
  local_28 = message;
  message_local = origin;
  origin_local._4_4_ = line;
  psStack_10 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b0);
  if (origin_local._4_4_ < 1) {
    std::operator<<(local_1a0,"ParserError at EOF: ");
  }
  else {
    poVar1 = std::operator<<(local_1a0,"ParserError at line: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,origin_local._4_4_);
    std::operator<<(poVar1," ");
  }
  poVar1 = std::operator<<(local_1a0,(string *)local_28);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_1a0,"\tfrom origin: ");
  std::operator<<(poVar1,(string *)message_local);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string
ninx::parser::exception::ParserException::make_message(int line, const std::string &origin, const std::string &message) {
    std::stringstream s;

    if (line > 0) {  // Error was found in a specific line
        s << "ParserError at line: " << line << " ";
    }else{   // the error was generated by encountering the end of file when unexpected.
        s << "ParserError at EOF: ";
    }

    s << message << std::endl;
    s << "\tfrom origin: " << origin;
    return s.str();
}